

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O1

int DSA_size(DSA *param_1)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  iVar7 = 0;
  if ((BIGNUM *)param_1->version != (BIGNUM *)0x0) {
    uVar2 = BN_num_bytes((BIGNUM *)param_1->version);
    uVar6 = (ulong)uVar2;
    lVar3 = 1;
    if (0x7e < uVar2) {
      uVar4 = uVar6 + 1;
      do {
        lVar3 = lVar3 + 1;
        bVar1 = 0xff < uVar4;
        uVar4 = uVar4 >> 8;
      } while (bVar1);
    }
    uVar4 = lVar3 + uVar6 + 2;
    if (uVar6 <= uVar4 && -1 < (long)uVar4) {
      uVar6 = uVar4 * 2;
      lVar3 = 1;
      uVar5 = uVar6;
      if (0x3f < uVar4) {
        do {
          lVar3 = lVar3 + 1;
          bVar1 = 0xff < uVar5;
          uVar5 = uVar5 >> 8;
        } while (bVar1);
      }
      uVar4 = lVar3 + uVar6 + 1;
      iVar7 = (int)uVar4;
      if (uVar4 < uVar6) {
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

int DSA_size(const DSA *dsa) {
  if (dsa->q == NULL) {
    return 0;
  }

  size_t order_len = BN_num_bytes(dsa->q);
  // Compute the maximum length of an |order_len| byte integer. Defensively
  // assume that the leading 0x00 is included.
  size_t integer_len = 1 /* tag */ + der_len_len(order_len + 1) + 1 + order_len;
  if (integer_len < order_len) {
    return 0;
  }
  // A DSA signature is two INTEGERs.
  size_t value_len = 2 * integer_len;
  if (value_len < integer_len) {
    return 0;
  }
  // Add the header.
  size_t ret = 1 /* tag */ + der_len_len(value_len) + value_len;
  if (ret < value_len) {
    return 0;
  }
  return ret;
}